

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStoragePython.cpp
# Opt level: O3

PyObject * PyInit_libmilstoragepython(void)

{
  int iVar1;
  char *__s1;
  class_<CoreML::MilStoragePython::MilStoragePythonWriter> *pcVar2;
  class_<CoreML::MilStoragePython::MilStoragePythonReader> *pcVar3;
  module m;
  class_<CoreML::MilStoragePython::MilStoragePythonWriter> blobStorageWriter;
  class_<CoreML::MilStoragePython::MilStoragePythonReader> blobStorageReader;
  bool local_151;
  handle local_150;
  handle local_148;
  handle local_140;
  undefined8 local_138;
  arg local_130;
  arg local_120;
  code *local_110;
  undefined8 local_108;
  arg_v local_100;
  code *local_c0;
  undefined8 local_b8;
  code *local_b0;
  undefined8 local_a8;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  undefined8 local_88;
  code *local_80;
  undefined8 local_78;
  code *local_70;
  undefined8 local_68;
  code *local_60;
  undefined8 local_58;
  code *local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  code *local_30;
  undefined8 local_28;
  code *local_20;
  undefined8 local_18;
  
  __s1 = (char *)Py_GetVersion();
  iVar1 = strncmp(__s1,"3.10",4);
  if ((iVar1 == 0) && (9 < (byte)(__s1[4] - 0x30U))) {
    pybind11::detail::get_internals();
    pybind11::module_::module_
              ((module_ *)&local_150,"libmilstoragepython",
               "Library to create, access and edit CoreML blob files.");
    local_100.super_arg.name = (char *)CONCAT71(local_100.super_arg.name._1_7_,1);
    pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
    class_<pybind11::module_local>
              ((class_<CoreML::MilStoragePython::MilStoragePythonWriter> *)&local_148,local_150,
               "_BlobStorageWriter",(module_local *)&local_100);
    local_120.name = "file_name";
    local_120._8_1_ = 2;
    local_151 = true;
    local_130.name = "truncate_file";
    local_130._8_1_ = 2;
    pybind11::arg_v::arg_v<bool>(&local_100,&local_130,&local_151,(char *)0x0);
    pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
    def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_apple[P]coremltools_deps_pybind11_include_pybind11_detail_init_h:205:13),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg_v>
              ((class_<CoreML::MilStoragePython::MilStoragePythonWriter> *)&local_148,"__init__",
               (type *)&local_130,(is_new_style_constructor *)&local_110,&local_120,&local_100);
    local_130.name = (char *)CoreML::MilStoragePython::MilStoragePythonWriter::write_int4_data;
    local_130._8_8_ = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<signed_char,16>const&)>
                       ((class_<CoreML::MilStoragePython::MilStoragePythonWriter> *)&local_148,
                        "write_int4_data",(offset_in_MilStoragePythonWriter_to_subr *)&local_130);
    local_110 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint1_data;
    local_108 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_char,16>const&)>
                       (pcVar2,"write_uint1_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_110);
    local_30 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint2_data;
    local_28 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_char,16>const&)>
                       (pcVar2,"write_uint2_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_30);
    local_40 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint3_data;
    local_38 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_char,16>const&)>
                       (pcVar2,"write_uint3_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_40);
    local_50 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint4_data;
    local_48 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_char,16>const&)>
                       (pcVar2,"write_uint4_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_50);
    local_60 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint6_data;
    local_58 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_char,16>const&)>
                       (pcVar2,"write_uint6_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_60);
    local_70 = CoreML::MilStoragePython::MilStoragePythonWriter::write_int8_data;
    local_68 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<signed_char,16>const&)>
                       (pcVar2,"write_int8_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_70);
    local_80 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint8_data;
    local_78 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_char,16>const&)>
                       (pcVar2,"write_uint8_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_80);
    local_90 = CoreML::MilStoragePython::MilStoragePythonWriter::write_int16_data;
    local_88 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<short,16>const&)>
                       (pcVar2,"write_int16_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_90);
    local_a0 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint16_data;
    local_98 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_short,16>const&)>
                       (pcVar2,"write_uint16_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_a0);
    local_b0 = CoreML::MilStoragePython::MilStoragePythonWriter::write_int32_data;
    local_a8 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<int,16>const&)>
                       (pcVar2,"write_int32_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_b0);
    local_c0 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint32_data;
    local_b8 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_int,16>const&)>
                       (pcVar2,"write_uint32_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_c0);
    local_140.m_ptr = (PyObject *)CoreML::MilStoragePython::MilStoragePythonWriter::write_fp16_data;
    local_138 = 0;
    pcVar2 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
             def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_short,16>const&)>
                       (pcVar2,"write_fp16_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_140);
    local_20 = CoreML::MilStoragePython::MilStoragePythonWriter::write_float_data;
    local_18 = 0;
    pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
    def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<float,16>const&)>
              (pcVar2,"write_float_data",(offset_in_MilStoragePythonWriter_to_subr *)&local_20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.type._M_dataplus._M_p != &local_100.type.field_2) {
      operator_delete(local_100.type._M_dataplus._M_p,
                      local_100.type.field_2._M_allocated_capacity + 1);
    }
    pybind11::handle::dec_ref(&local_100.value.super_handle);
    local_100.super_arg.name = (char *)CONCAT71(local_100.super_arg.name._1_7_,1);
    pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
    class_<pybind11::module_local>
              ((class_<CoreML::MilStoragePython::MilStoragePythonReader> *)&local_140,local_150,
               "_BlobStorageReader",(module_local *)&local_100);
    pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
    def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_apple[P]coremltools_deps_pybind11_include_pybind11_detail_init_h:205:13),_pybind11::detail::is_new_style_constructor>
              ((class_<CoreML::MilStoragePython::MilStoragePythonReader> *)&local_140,"__init__",
               (type *)&local_100,(is_new_style_constructor *)&local_130);
    local_100.super_arg.name =
         (char *)CoreML::MilStoragePython::MilStoragePythonReader::read_int4_data;
    local_100.super_arg._8_8_ = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<signed_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       ((class_<CoreML::MilStoragePython::MilStoragePythonReader> *)&local_140,
                        "read_int4_data",(offset_in_MilStoragePythonWriter_to_subr *)&local_100);
    local_130.name = (char *)CoreML::MilStoragePython::MilStoragePythonReader::read_uint1_data;
    local_130._8_8_ = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint1_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_130);
    local_120.name = (char *)CoreML::MilStoragePython::MilStoragePythonReader::read_uint2_data;
    local_120._8_8_ = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint2_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_120);
    local_110 = CoreML::MilStoragePython::MilStoragePythonReader::read_uint3_data;
    local_108 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint3_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_110);
    local_30 = CoreML::MilStoragePython::MilStoragePythonReader::read_uint4_data;
    local_28 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint4_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_30);
    local_40 = CoreML::MilStoragePython::MilStoragePythonReader::read_uint6_data;
    local_38 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint6_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_40);
    local_50 = CoreML::MilStoragePython::MilStoragePythonReader::read_int8_data;
    local_48 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<signed_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_int8_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_50);
    local_60 = CoreML::MilStoragePython::MilStoragePythonReader::read_uint8_data;
    local_58 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_char,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint8_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_60);
    local_70 = CoreML::MilStoragePython::MilStoragePythonReader::read_int16_data;
    local_68 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<short,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_int16_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_70);
    local_80 = CoreML::MilStoragePython::MilStoragePythonReader::read_uint16_data;
    local_78 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_short,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint16_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_80);
    local_90 = CoreML::MilStoragePython::MilStoragePythonReader::read_int32_data;
    local_88 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<int,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_int32_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_90);
    local_a0 = CoreML::MilStoragePython::MilStoragePythonReader::read_uint32_data;
    local_98 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_int,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_uint32_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_a0);
    local_b0 = CoreML::MilStoragePython::MilStoragePythonReader::read_fp16_data;
    local_a8 = 0;
    pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
             def<pybind11::array_t<unsigned_short,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                       (pcVar3,"read_fp16_data",
                        (offset_in_MilStoragePythonWriter_to_subr *)&local_b0);
    local_c0 = CoreML::MilStoragePython::MilStoragePythonReader::read_float_data;
    local_b8 = 0;
    pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
    def<pybind11::array_t<float,16>(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
              (pcVar3,"read_float_data",(offset_in_MilStoragePythonWriter_to_subr *)&local_c0);
    pybind11::handle::dec_ref(&local_140);
    pybind11::handle::dec_ref(&local_148);
    pybind11::handle::dec_ref(&local_150);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    local_150.m_ptr = (PyObject *)0x0;
  }
  return local_150.m_ptr;
}

Assistant:

PYBIND11_PLUGIN(libmilstoragepython) {
    py::module m("libmilstoragepython", "Library to create, access and edit CoreML blob files.");

    // As we have both pybind for the same MilStoragePythonWriter class, we need to set module_local
    // to avoid conflicts between coremltools and coremltools-internal.
    py::class_<MilStoragePythonWriter> blobStorageWriter(m, "_BlobStorageWriter", py::module_local());
    blobStorageWriter.def(py::init<const std::string&, bool>(), py::arg("file_name"), py::arg("truncate_file") = true)
      .def("write_int4_data", &MilStoragePythonWriter::write_int4_data)
      .def("write_uint1_data", &MilStoragePythonWriter::write_uint1_data)
      .def("write_uint2_data", &MilStoragePythonWriter::write_uint2_data)
      .def("write_uint3_data", &MilStoragePythonWriter::write_uint3_data)
      .def("write_uint4_data", &MilStoragePythonWriter::write_uint4_data)
      .def("write_uint6_data", &MilStoragePythonWriter::write_uint6_data)
      .def("write_int8_data", &MilStoragePythonWriter::write_int8_data)
      .def("write_uint8_data", &MilStoragePythonWriter::write_uint8_data)
      .def("write_int16_data", &MilStoragePythonWriter::write_int16_data)
      .def("write_uint16_data", &MilStoragePythonWriter::write_uint16_data)
      .def("write_int32_data", &MilStoragePythonWriter::write_int32_data)
      .def("write_uint32_data", &MilStoragePythonWriter::write_uint32_data)
      .def("write_fp16_data", &MilStoragePythonWriter::write_fp16_data)
      .def("write_float_data", &MilStoragePythonWriter::write_float_data);

    py::class_<MilStoragePythonReader> blobStorageReader(m, "_BlobStorageReader", py::module_local());
    blobStorageReader.def(py::init<std::string>())
      .def("read_int4_data", &MilStoragePythonReader::read_int4_data)
      .def("read_uint1_data", &MilStoragePythonReader::read_uint1_data)
      .def("read_uint2_data", &MilStoragePythonReader::read_uint2_data)
      .def("read_uint3_data", &MilStoragePythonReader::read_uint3_data)
      .def("read_uint4_data", &MilStoragePythonReader::read_uint4_data)
      .def("read_uint6_data", &MilStoragePythonReader::read_uint6_data)
      .def("read_int8_data", &MilStoragePythonReader::read_int8_data)
      .def("read_uint8_data", &MilStoragePythonReader::read_uint8_data)
      .def("read_int16_data", &MilStoragePythonReader::read_int16_data)
      .def("read_uint16_data", &MilStoragePythonReader::read_uint16_data)
      .def("read_int32_data", &MilStoragePythonReader::read_int32_data)
      .def("read_uint32_data", &MilStoragePythonReader::read_uint32_data)
      .def("read_fp16_data", &MilStoragePythonReader::read_fp16_data)
      .def("read_float_data", &MilStoragePythonReader::read_float_data);

    return m.ptr();
}